

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O1

int N_VLinearCombination_Serial(int nvec,realtype *c,N_Vector *X,N_Vector z)

{
  long lVar1;
  long lVar2;
  N_Vector p_Var3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  
  if (nvec < 1) {
    return -1;
  }
  if (nvec == 2) {
    N_VLinearSum_Serial(*c,*X,c[1],X[1],z);
  }
  else if (nvec == 1) {
    N_VScale_Serial(*c,*X,z);
  }
  else {
    lVar1 = *z->content;
    lVar2 = *(long *)((long)z->content + 0x10);
    p_Var3 = *X;
    if (p_Var3 == z) {
      if ((*c == 1.0) && (!NAN(*c))) {
        if (nvec == 1) {
          return 0;
        }
        uVar4 = 1;
        do {
          if (0 < lVar1) {
            lVar5 = *(long *)((long)X[uVar4]->content + 0x10);
            lVar6 = 0;
            do {
              *(double *)(lVar2 + lVar6 * 8) =
                   c[uVar4] * *(double *)(lVar5 + lVar6 * 8) + *(double *)(lVar2 + lVar6 * 8);
              lVar6 = lVar6 + 1;
            } while (lVar1 != lVar6);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != (uint)nvec);
        return 0;
      }
      if (p_Var3 == z) {
        if (0 < lVar1) {
          lVar5 = 0;
          do {
            *(double *)(lVar2 + lVar5 * 8) = *c * *(double *)(lVar2 + lVar5 * 8);
            lVar5 = lVar5 + 1;
          } while (lVar1 != lVar5);
        }
        if (nvec == 1) {
          return 0;
        }
        uVar4 = 2;
        if (2 < nvec) {
          uVar4 = (ulong)(uint)nvec;
        }
        uVar7 = 1;
        do {
          if (0 < lVar1) {
            lVar5 = *(long *)((long)X[uVar7]->content + 0x10);
            lVar6 = 0;
            do {
              *(double *)(lVar2 + lVar6 * 8) =
                   c[uVar7] * *(double *)(lVar5 + lVar6 * 8) + *(double *)(lVar2 + lVar6 * 8);
              lVar6 = lVar6 + 1;
            } while (lVar1 != lVar6);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar4);
        return 0;
      }
    }
    if (0 < lVar1) {
      lVar5 = *(long *)((long)p_Var3->content + 0x10);
      lVar6 = 0;
      do {
        *(double *)(lVar2 + lVar6 * 8) = *c * *(double *)(lVar5 + lVar6 * 8);
        lVar6 = lVar6 + 1;
      } while (lVar1 != lVar6);
    }
    if (nvec != 1) {
      uVar4 = 2;
      if (2 < nvec) {
        uVar4 = (ulong)(uint)nvec;
      }
      uVar7 = 1;
      do {
        if (0 < lVar1) {
          lVar5 = *(long *)((long)X[uVar7]->content + 0x10);
          lVar6 = 0;
          do {
            *(double *)(lVar2 + lVar6 * 8) =
                 c[uVar7] * *(double *)(lVar5 + lVar6 * 8) + *(double *)(lVar2 + lVar6 * 8);
            lVar6 = lVar6 + 1;
          } while (lVar1 != lVar6);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar4);
    }
  }
  return 0;
}

Assistant:

int N_VLinearCombination_Serial(int nvec, realtype* c, N_Vector* X, N_Vector z)
{
  int          i;
  sunindextype j, N;
  realtype*    zd=NULL;
  realtype*    xd=NULL;

  /* invalid number of vectors */
  if (nvec < 1) return(-1);

  /* should have called N_VScale */
  if (nvec == 1) {
    N_VScale_Serial(c[0], X[0], z);
    return(0);
  }

  /* should have called N_VLinearSum */
  if (nvec == 2) {
    N_VLinearSum_Serial(c[0], X[0], c[1], X[1], z);
    return(0);
  }

  /* get vector length and data array */
  N  = NV_LENGTH_S(z);
  zd = NV_DATA_S(z);

  /*
   * X[0] += c[i]*X[i], i = 1,...,nvec-1
   */
  if ((X[0] == z) && (c[0] == ONE)) {
    for (i=1; i<nvec; i++) {
      xd = NV_DATA_S(X[i]);
      for (j=0; j<N; j++) {
        zd[j] += c[i] * xd[j];
      }
    }
    return(0);
  }

  /*
   * X[0] = c[0] * X[0] + sum{ c[i] * X[i] }, i = 1,...,nvec-1
   */
  if (X[0] == z) {
    for (j=0; j<N; j++) {
      zd[j] *= c[0];
    }
    for (i=1; i<nvec; i++) {
      xd = NV_DATA_S(X[i]);
      for (j=0; j<N; j++) {
        zd[j] += c[i] * xd[j];
      }
    }
    return(0);
  }

  /*
   * z = sum{ c[i] * X[i] }, i = 0,...,nvec-1
   */
  xd = NV_DATA_S(X[0]);
  for (j=0; j<N; j++) {
    zd[j] = c[0] * xd[j];
  }
  for (i=1; i<nvec; i++) {
    xd = NV_DATA_S(X[i]);
    for (j=0; j<N; j++) {
      zd[j] += c[i] * xd[j];
    }
  }
  return(0);
}